

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void make_corpse(CHAR_DATA *killer,CHAR_DATA *ch)

{
  byte *pbVar1;
  undefined2 uVar2;
  ulong uVar3;
  OBJ_DATA *obj;
  bool bVar4;
  short sVar5;
  int iVar6;
  OBJ_INDEX_DATA *pOVar7;
  OBJ_DATA *obj_to;
  char *pcVar8;
  OBJ_DATA *pOVar9;
  char *pcVar10;
  short sVar11;
  char **ppcVar12;
  OBJ_AFFECT_DATA oaf;
  char buf [4608];
  int in_stack_ffffffffffffed8c;
  char local_1228 [4608];
  
  bVar4 = is_npc(ch);
  if (bVar4) {
    pcVar10 = ch->short_descr;
    pOVar7 = get_obj_index(0);
    obj_to = create_object(pOVar7,0);
    iVar6 = number_range(5,8);
    obj_to->timer = (short)iVar6;
    bVar4 = is_npc(killer);
    ppcVar12 = &killer->short_descr;
    if (!bVar4) {
      ppcVar12 = &killer->true_name;
    }
    pcVar8 = palloc_string(*ppcVar12);
    obj_to->talked = pcVar8;
    if (0 < ch->gold) {
      pOVar9 = create_money(in_stack_ffffffffffffed8c);
      obj_to_obj(pOVar9,obj_to);
      ch->gold = 0;
    }
    obj_to->cost = 0;
    obj_to->mob_vnum = (int)ch->pIndexData->vnum;
  }
  else {
    pcVar10 = ch->name;
    pOVar7 = get_obj_index(0);
    obj_to = create_object(pOVar7,0);
    iVar6 = number_range(0x14,0x23);
    obj_to->timer = (short)iVar6;
    if ((ch->in_room != (ROOM_INDEX_DATA *)0x0) && (bVar4 = is_explore(ch->in_room), bVar4)) {
      iVar6 = number_range(6,9);
      obj_to->timer = (short)iVar6;
    }
    obj_to->value[4] = ch->hometown;
    bVar4 = is_npc(killer);
    ppcVar12 = &killer->short_descr;
    if (!bVar4) {
      ppcVar12 = &killer->true_name;
    }
    pcVar8 = palloc_string(*ppcVar12);
    obj_to->talked = pcVar8;
    pcVar8 = palloc_string(ch->true_name);
    obj_to->owner = pcVar8;
    if (1 < ch->gold) {
      pOVar9 = create_money(in_stack_ffffffffffffed8c);
      obj_to_obj(pOVar9,obj_to);
      ch->gold = 0;
    }
    obj_to->cost = 0;
  }
  uVar2 = ch->level;
  sVar11 = 100;
  if ((short)uVar2 < 100) {
    sVar11 = uVar2;
  }
  sVar5 = 1;
  if (1 < sVar11) {
    sVar5 = sVar11;
  }
  obj_to->level = sVar5;
  bVar4 = is_npc(ch);
  if ((bVar4) && (((ch->act[0] & 0x4000) != 0 || ((ch->form[0] & 0x100) != 0)))) {
    pbVar1 = (byte *)((long)obj_to->extra_flags + 3);
    *pbVar1 = *pbVar1 | 8;
  }
  obj_to->value[2] = (int)ch->size;
  sprintf(local_1228,obj_to->short_descr,pcVar10);
  free_pstring(obj_to->short_descr);
  pcVar8 = palloc_string(local_1228);
  obj_to->short_descr = pcVar8;
  sprintf(local_1228,obj_to->description,pcVar10);
  free_pstring(obj_to->description);
  pcVar10 = palloc_string(local_1228);
  obj_to->description = pcVar10;
  obj_to->ohp = (int)ch->max_hit;
  pOVar9 = ch->carrying;
  while (obj = pOVar9, obj != (OBJ_DATA *)0x0) {
    pOVar9 = obj->next_content;
    if ((obj->extra_flags[0] & 0x4000000) == 0) {
      bVar4 = is_npc(ch);
      if ((bVar4) || ((obj->extra_flags[0] & 0x20000) == 0)) {
        obj_from_char(obj);
        if (obj->item_type == 10) {
          iVar6 = number_range(500,1000);
          obj->timer = (short)iVar6;
        }
        if (obj->item_type == 2) {
          iVar6 = number_range(1000,0x9c4);
          obj->timer = (short)iVar6;
        }
        if ((short)obj->extra_flags[0] < 0) {
          obj->timer = 1;
          obj->extra_flags[0] = obj->extra_flags[0] & 0xffffffffffff7fff;
        }
        if ((0 < obj->pIndexData->start_timer) && (bVar4 = is_npc(ch), bVar4)) {
          obj->timer = obj->pIndexData->start_timer;
        }
        uVar3 = obj->extra_flags[0];
        obj->extra_flags[0] = uVar3 & 0xfffffffffffeffff;
        sVar11 = obj->pIndexData->limtotal;
        if (sVar11 < 1 || obj->pIndexData->limcount <= sVar11) {
          if ((((uint)uVar3 >> 0x1a & 1) == 0) &&
             ((bVar4 = is_npc(ch), bVar4 || ((obj->extra_flags[0] & 0x20000) == 0)))) {
            obj_to_obj(obj,obj_to);
          }
        }
        else {
          act("$p flashes brightly and vaporizes.",ch,obj,(void *)0x0,0);
          extract_obj(obj);
        }
      }
      else {
        unequip_char(ch,obj,false);
        equip_char(ch,obj,(int)obj->wear_loc,false);
      }
    }
  }
  obj_to_room(obj_to,ch->in_room);
  bVar4 = is_affected(ch,(int)gsn_noxious_ward);
  if (bVar4) {
    act("A cloud of thick smoke billows out of your corpse!",ch,obj_to,(void *)0x0,3);
    act("A cloud of thick smoke billows out of $p!",ch,obj_to,(void *)0x0,0);
    init_affect_obj((OBJ_AFFECT_DATA *)&stack0xffffffffffffed88);
    affect_to_obj(obj_to,(OBJ_AFFECT_DATA *)&stack0xffffffffffffed88);
  }
  bVar4 = is_affected(ch,(int)gsn_ultradiffusion);
  if (bVar4) {
    extract_obj(obj_to);
  }
  return;
}

Assistant:

void make_corpse(CHAR_DATA *killer, CHAR_DATA *ch)
{
	char buf[MAX_STRING_LENGTH];
	OBJ_DATA *corpse;
	OBJ_DATA *obj;
	OBJ_DATA *obj_next;
	char *name;
	OBJ_AFFECT_DATA oaf;

	if (is_npc(ch))
	{
		name = ch->short_descr;
		corpse = create_object(get_obj_index(OBJ_VNUM_CORPSE_NPC), 0);
		corpse->timer = number_range(5, 8);
		// free_pstring(corpse->talked);

		if (is_npc(killer))
			corpse->talked = palloc_string(killer->short_descr);
		else
			corpse->talked = palloc_string(killer->true_name);

		if (ch->gold > 0)
		{
			obj_to_obj(create_money(ch->gold), corpse);
			ch->gold = 0;
		}

		corpse->cost = 0;
		corpse->mob_vnum = ch->pIndexData->vnum;
	}
	else
	{
		name = ch->name;
		corpse = create_object(get_obj_index(OBJ_VNUM_CORPSE_PC), 0);
		corpse->timer = number_range(20, 35);

		if (ch->in_room && is_explore(ch->in_room))
			corpse->timer = number_range(6, 9);

		corpse->value[4] = ch->hometown;

		// free_pstring(corpse->talked);
		if (is_npc(killer))
			corpse->talked = palloc_string(killer->short_descr);
		else
			corpse->talked = palloc_string(killer->true_name);

		corpse->owner = palloc_string(ch->true_name);

		if (ch->gold > 1)
		{
			obj_to_obj(create_money(ch->gold), corpse);
			ch->gold = 0;
		}

		corpse->cost = 0;
	}

	corpse->level = URANGE(1, ch->level, 100);

	if (is_npc(ch) && (IS_SET(ch->act, ACT_UNDEAD) || IS_SET(ch->form, FORM_UNDEAD)))
		SET_BIT(corpse->extra_flags, CORPSE_NO_ANIMATE);

	corpse->value[2] = ch->size;

	sprintf(buf, corpse->short_descr, name);
	free_pstring(corpse->short_descr);
	corpse->short_descr = palloc_string(buf);

	sprintf(buf, corpse->description, name);
	free_pstring(corpse->description);
	corpse->description = palloc_string(buf);
	corpse->ohp = ch->max_hit;
	for (obj = ch->carrying; obj != nullptr; obj = obj_next)
	{
		bool floating = false;

		obj_next = obj->next_content;
		if (IS_SET(obj->extra_flags, ITEM_BRAND))
			continue;

		if (!is_npc(ch) && IS_SET(obj->extra_flags, ITEM_FIXED))
		{
			unequip_char(ch, obj, false);
			equip_char(ch, obj, obj->wear_loc, false);
			continue;
		}

		obj_from_char(obj);

		if (obj->item_type == ITEM_POTION)
			obj->timer = number_range(500, 1000);

		if (obj->item_type == ITEM_SCROLL)
			obj->timer = number_range(1000, 2500);

		if (IS_SET(obj->extra_flags, ITEM_ROT_DEATH) && !floating)
		{
			obj->timer = 1;
			REMOVE_BIT(obj->extra_flags, ITEM_ROT_DEATH);
		}

		if (obj->pIndexData->start_timer > 0 && is_npc(ch))
			obj->timer = obj->pIndexData->start_timer;

		REMOVE_BIT(obj->extra_flags, ITEM_VIS_DEATH);

		if (obj->pIndexData->limcount > obj->pIndexData->limtotal && obj->pIndexData->limtotal > 0)
		{
			act("$p flashes brightly and vaporizes.", ch, obj, nullptr, TO_ROOM);
			extract_obj(obj);
			continue;
		}
		else if (floating)
		{
			if (obj != nullptr && is_obj_stat(obj, ITEM_ROT_DEATH)) /* get rid of it! */
			{
				if (obj->contains != nullptr)
				{
					OBJ_DATA *in, *in_next;

					act("$p evaporates, scattering its contents.", ch, obj, nullptr, TO_ROOM);

					for (in = obj->contains; in != nullptr; in = in_next)
					{
						in_next = in->next_content;
						obj_from_obj(in);
						obj_to_room(in, ch->in_room);
					}
				}
				else
				{
					act("$p evaporates.", ch, obj, nullptr, TO_ROOM);
				}

				extract_obj(obj);
			}
			else
			{
				act("$p falls to the floor.", ch, obj, nullptr, TO_ROOM);
				obj_to_room(obj, ch->in_room);
			}
		}
		//	else if (obj->wear_loc == WEAR_BRAND)
		else if (IS_SET(obj->extra_flags, ITEM_BRAND))
		{
			/* nothing */
		}
		else if (!is_npc(ch) && IS_SET(obj->extra_flags, ITEM_FIXED))
		{
			/* nothing */
		}
		else
		{
			obj_to_obj(obj, corpse);
		}
	}
	obj_to_room(corpse, ch->in_room);

	if (is_affected(ch, gsn_noxious_ward))
	{
		act("A cloud of thick smoke billows out of your corpse!", ch, corpse, nullptr, TO_CHAR);
		act("A cloud of thick smoke billows out of $p!", ch, corpse, nullptr, TO_ROOM);
		init_affect_obj(&oaf);
		oaf.where = TO_OBJ_AFFECTS;
		oaf.type = gsn_noxious_ward;
		oaf.duration = -1;
		affect_to_obj(corpse, &oaf);
	}

	if (is_affected(ch, gsn_ultradiffusion))
		extract_obj(corpse);
}